

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,ElseStatement *statement)

{
  undefined1 *puVar1;
  CompoundStatement *pCVar2;
  int iVar3;
  
  puVar1 = &this->field_0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n",1);
  if (0 < this->n_spaces) {
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"    ",4);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->n_spaces);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"else:\n",6);
  this->n_spaces = this->n_spaces + 1;
  pCVar2 = ElseStatement::getStatements(statement);
  (**(pCVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar2,this);
  this->n_spaces = this->n_spaces + -1;
  return;
}

Assistant:

void PrettyPrinter::visit(ElseStatement* statement) {
    output << "\n";
    print_indentation();
    output << "else:\n";
    indent();
    statement->getStatements()->accept(this);
    dedent();
}